

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractslider.cpp
# Opt level: O2

void __thiscall QAbstractSlider::setRange(QAbstractSlider *this,int min,int max)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  lVar3 = *(long *)&(this->super_QWidget).field_0x8;
  iVar1 = *(int *)(lVar3 + 0x254);
  iVar2 = *(int *)(lVar3 + 600);
  *(int *)(lVar3 + 0x254) = min;
  if (max < min) {
    max = min;
  }
  *(int *)(lVar3 + 600) = max;
  if ((iVar1 == min) && (iVar2 == max)) {
    return;
  }
  (**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this,0);
  rangeChanged(this,*(int *)(lVar3 + 0x254),*(int *)(lVar3 + 600));
  setValue(this,*(int *)(lVar3 + 0x260));
  return;
}

Assistant:

void QAbstractSlider::setRange(int min, int max)
{
    Q_D(QAbstractSlider);
    int oldMin = d->minimum;
    int oldMax = d->maximum;
    d->minimum = min;
    d->maximum = qMax(min, max);
    if (oldMin != d->minimum || oldMax != d->maximum) {
        sliderChange(SliderRangeChange);
        emit rangeChanged(d->minimum, d->maximum);
        setValue(d->value); // re-bound
    }
}